

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrypt.c
# Opt level: O0

void kdf_scrypt_init(KDF_SCRYPT *ctx)

{
  KDF_SCRYPT *ctx_local;
  
  ctx->N = 0x100000;
  ctx->r = 8;
  ctx->p = 1;
  ctx->maxmem_bytes = 0x40100000;
  return;
}

Assistant:

static void kdf_scrypt_init(KDF_SCRYPT *ctx)
{
    /* Default values are the most conservative recommendation given in the
     * original paper of C. Percival. Derivation uses roughly 1 GiB of memory
     * for this parameter choice (approx. 128 * r * N * p bytes).
     */
    ctx->N = 1 << 20;
    ctx->r = 8;
    ctx->p = 1;
    ctx->maxmem_bytes = 1025 * 1024 * 1024;
}